

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,char *tgt)

{
  char *__s1;
  int iVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  char *__s2;
  
  do {
    pcVar2 = this;
    this = pcVar2->Parent;
  } while (pcVar2->Parent != (cmGeneratorExpressionDAGChecker *)0x0);
  __s1 = (pcVar2->Property)._M_dataplus._M_p;
  if (tgt == (char *)0x0) {
    iVar1 = strcmp(__s1,"LINK_LIBRARIES");
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strcmp(__s1,"LINK_INTERFACE_LIBRARIES");
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strcmp(__s1,"IMPORTED_LINK_INTERFACE_LIBRARIES");
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strncmp(__s1,"LINK_INTERFACE_LIBRARIES_",0x19);
    if (iVar1 == 0) {
      return true;
    }
    iVar1 = strncmp(__s1,"IMPORTED_LINK_INTERFACE_LIBRARIES_",0x22);
    if (iVar1 == 0) {
      return true;
    }
    __s2 = "INTERFACE_LINK_LIBRARIES";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&pcVar2->Target);
    if (iVar1 != 0) {
      return false;
    }
    __s2 = "LINK_LIBRARIES";
  }
  iVar1 = strcmp(__s1,__s2);
  return iVar1 == 0;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(const char *tgt)
{
  const cmGeneratorExpressionDAGChecker *top = this;
  const cmGeneratorExpressionDAGChecker *parent = this->Parent;
  while (parent)
    {
    top = parent;
    parent = parent->Parent;
    }

  const char *prop = top->Property.c_str();

  if (tgt)
    {
    return top->Target == tgt && strcmp(prop, "LINK_LIBRARIES") == 0;
    }

  return (strcmp(prop, "LINK_LIBRARIES") == 0
       || strcmp(prop, "LINK_INTERFACE_LIBRARIES") == 0
       || strcmp(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES") == 0
       || cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_")
       || cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_"))
       || strcmp(prop, "INTERFACE_LINK_LIBRARIES") == 0;
}